

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O2

void Rand_init(void)

{
  __pid_t _Var1;
  ulong uVar2;
  
  if (Rand_quick) {
    uVar2 = time((time_t *)0x0);
    _Var1 = getpid();
    Rand_quick = false;
    Rand_state_init(((uint)(uVar2 >> 3) & 0x1fffffff) * _Var1 * 2);
    return;
  }
  return;
}

Assistant:

void Rand_init(void)
{
	/* Init RNG */
	if (Rand_quick) {
		uint32_t seed;

		/* Basic seed */
		seed = (uint32_t)(time(NULL));

#ifdef UNIX
		/* Mutate the seed on Unix machines */
		seed = ((seed >> 3) * (getpid() << 1));
#elif defined(_WIN32)
		/* Or on Windows */
		seed = ((seed >> 3) * (GetCurrentProcessId() << 1));
#endif

		/* Use the complex RNG */
		Rand_quick = false;

		/* Seed the "complex" RNG */
		Rand_state_init(seed);
	}
}